

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1518.c
# Opt level: O0

int test(char *URL)

{
  undefined8 local_48;
  char *redirectUrl;
  char *effectiveUrl;
  long curlRedirectCount;
  long curlResponseCode;
  long lStack_20;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  curlResponseCode._4_4_ = 0;
  redirectUrl = (char *)0x0;
  local_48 = 0;
  curl = (CURL *)URL;
  lStack_20 = curl_easy_init();
  if (lStack_20 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
    URL_local._4_4_ = 0x7e;
  }
  else {
    curlResponseCode._4_4_ = curl_easy_setopt(lStack_20,0x2712,curl);
    if ((curlResponseCode._4_4_ == 0) &&
       (curlResponseCode._4_4_ = curl_easy_setopt(lStack_20,0x34,0), curlResponseCode._4_4_ == 0)) {
      curlResponseCode._4_4_ = curl_easy_perform(lStack_20);
      curl_easy_getinfo(lStack_20,0x200002,&curlRedirectCount);
      curl_easy_getinfo(lStack_20,0x200014,&effectiveUrl);
      curl_easy_getinfo(lStack_20,0x100001,&redirectUrl);
      curl_easy_getinfo(lStack_20,0x10001f,&local_48);
      curl_mprintf("res: %d\nstatus: %d\nredirects: %d\neffectiveurl: %s\nredirecturl: %s\n",
                   curlResponseCode._4_4_,curlRedirectCount & 0xffffffff,
                   (ulong)effectiveUrl & 0xffffffff,redirectUrl,local_48);
    }
    curl_easy_cleanup(lStack_20);
    curl_global_cleanup();
    URL_local._4_4_ = curlResponseCode._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  long curlResponseCode;
  long curlRedirectCount;
  char *effectiveUrl = NULL;
  char *redirectUrl = NULL;

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  /* just to make it explicit and visible in this test: */
  test_setopt(curl, CURLOPT_FOLLOWLOCATION, 0L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

  curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &curlResponseCode);
  curl_easy_getinfo(curl, CURLINFO_REDIRECT_COUNT, &curlRedirectCount);
  curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &effectiveUrl);
  curl_easy_getinfo(curl, CURLINFO_REDIRECT_URL, &redirectUrl);

  printf("res: %d\n"
         "status: %d\n"
         "redirects: %d\n"
         "effectiveurl: %s\n"
         "redirecturl: %s\n",
         (int)res,
         (int)curlResponseCode,
         (int)curlRedirectCount,
         effectiveUrl,
         redirectUrl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}